

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StandardCaseItemSyntax::setChild
          (StandardCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffffa8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffffb0;
  SyntaxNode *local_30;
  not_null<slang::syntax::SyntaxNode_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7cb03c);
    SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>(pSVar1);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffa8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x50) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x58) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7cb094);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7cb0a4);
      local_30 = SyntaxNode::as<slang::syntax::SyntaxNode>(pSVar1);
    }
    not_null<slang::syntax::SyntaxNode_*>::not_null<slang::syntax::SyntaxNode_*>
              (&local_28,&local_30);
    *(SyntaxNode **)(in_RDI + 0x60) = local_28.ptr;
  }
  return;
}

Assistant:

void StandardCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: clause = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}